

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  sexp_conflict sexp_siginfo_t_type_obj;
  sexp_conflict sexp_sigset_t_type_obj;
  code *env_00;
  sexp_conflict ctx_00;
  int **local_98;
  undefined8 local_90;
  int *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  long local_18;
  
  local_58 = 0x43e;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_18 = in_RDI;
  memset(&local_68,0,0x10);
  local_70 = 0x43e;
  memset(&local_80,0,0x10);
  local_88 = (int *)0x43e;
  memset(&local_98,0,0x10);
  iVar2 = strcmp(local_38,"0.11.0");
  if ((iVar2 == 0) && (iVar2 = strncmp(local_40,"cv-gm*uh",8), iVar2 == 0)) {
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_80;
    local_98 = &local_88;
    local_90 = *(undefined8 *)(local_18 + 0x6080);
    *(int ****)(local_18 + 0x6080) = &local_98;
    uVar3 = sexp_intern(local_18,"wait/no-hang");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/tty-output",0x11);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x16,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/tty-input");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x15,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/tty-stop");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x14,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/stop");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x13,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/continue",0xf);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x12,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/child",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x11,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/user2",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0xc,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/user1",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/term",0xb);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0xf,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/alarm",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0xe,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/pipe",0xb);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0xd,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/segv",0xb);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0xb,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/kill",0xb);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,9,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/fpe",10);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,8,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/abort",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,6,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/illegal");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,4,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/quit",0xb);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,3,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/interrupt",0x10);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"signal/hang-up",0xe);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    local_58 = sexp_c_string(local_18,"sigset_t",0xffffffffffffffff);
    local_48 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_48);
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58,local_48);
    local_58 = sexp_intern(local_18,"signal-set?",0xb);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_58 = sexp_c_string(local_18,"siginfo_t",0xffffffffffffffff);
    local_50 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_50);
    lVar1 = local_18;
    *(undefined8 *)(local_50 + 0x18) = 0x23e;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"si_status",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"si_uid",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"si_pid",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"si_code",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"si_errno",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_50 + 0x18;
    uVar5 = sexp_intern(local_18,"si_signo",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    uVar5 = sexp_make_vector_op(local_18,0,2,0xd,0x3e);
    *(undefined8 *)(local_50 + 0x20) = uVar5;
    uVar5 = sexp_make_vector_op(local_18,0,2,0xd,0x3e);
    *(undefined8 *)(local_50 + 0x28) = uVar5;
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58,local_50);
    local_58 = sexp_intern(local_18,"signal-info?",0xc);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-status",1,0,
                                 "sexp_siginfo_t_get_si_status",sexp_siginfo_t_get_si_status,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-uid",1,0,"sexp_siginfo_t_get_si_uid",
                                 sexp_siginfo_t_get_si_uid,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-pid",1,0,"sexp_siginfo_t_get_si_pid",
                                 sexp_siginfo_t_get_si_pid,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-code",1,0,"sexp_siginfo_t_get_si_code",
                                 sexp_siginfo_t_get_si_code,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-error-number",1,0,
                                 "sexp_siginfo_t_get_si_errno",sexp_siginfo_t_get_si_errno,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-number",1,0,"sexp_siginfo_t_get_si_signo"
                                 ,sexp_siginfo_t_get_si_signo,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"parent-process-id",0,0,
                                 "sexp_parent_process_id_stub",sexp_parent_process_id_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"current-process-id",0,0,
                                 "sexp_current_process_id_stub",sexp_current_process_id_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"execvp",2,0,"sexp_execvp_stub",sexp_execvp_stub,
                                 0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      local_88[0xc] = 0x13;
      local_88[0xd] = 0;
      local_88[0xe] = 0x13;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"%exit",1,0,"sexp_25_exit_stub",sexp_25_exit_stub
                                 ,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x43e;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"kill",2,0,"sexp_kill_stub",sexp_kill_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"waitpid",2,0,"sexp_waitpid_stub",
                                 sexp_waitpid_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"fork",0,0,"sexp_fork_stub",sexp_fork_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"%fork",0,0,"sexp_25_fork_stub",sexp_25_fork_stub
                                 ,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"sleep",1,0,"sexp_sleep_stub",sexp_sleep_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"alarm",1,0,"sexp_alarm_stub",sexp_alarm_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"current-signal-mask",0,0,
                                 "sexp_current_signal_mask_stub",sexp_current_signal_mask_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-mask-set!",1,0,
                                 "sexp_signal_mask_set_x_stub",sexp_signal_mask_set_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-mask-unblock!",1,0,
                                 "sexp_signal_mask_unblock_x_stub",sexp_signal_mask_unblock_x_stub,0
                                );
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-mask-block!",1,0,
                                 "sexp_signal_mask_block_x_stub",sexp_signal_mask_block_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-set-contains?",2,0,
                                 "sexp_signal_set_contains_p_stub",sexp_signal_set_contains_p_stub,0
                                );
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0xb;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-set-delete!",2,0,
                                 "sexp_signal_set_delete_x_stub",sexp_signal_set_delete_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-set-add!",2,0,
                                 "sexp_signal_set_add_x_stub",sexp_signal_set_add_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"signal-set-fill!",1,0,
                                 "sexp_signal_set_fill_x_stub",sexp_signal_set_fill_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"make-signal-set",0,0,"sexp_make_signal_set_stub"
                                 ,sexp_make_signal_set_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    env_00 = sexp_set_signal_action_x_stub;
    ctx_00 = (sexp_conflict)0x0;
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-signal-action!",2,0,
                                 "sexp_set_signal_action_x_stub");
    sexp_init_signals(ctx_00,(sexp_conflict)env_00);
    *(undefined8 *)(local_18 + 0x6080) = local_60;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_sigset_t_type_obj;
  sexp sexp_siginfo_t_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "wait/no-hang", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, WNOHANG));
  name = sexp_intern(ctx, "signal/tty-output", 17);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTTOU));
  name = sexp_intern(ctx, "signal/tty-input", 16);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTTIN));
  name = sexp_intern(ctx, "signal/tty-stop", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTSTP));
  name = sexp_intern(ctx, "signal/stop", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGSTOP));
  name = sexp_intern(ctx, "signal/continue", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGCONT));
  name = sexp_intern(ctx, "signal/child", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGCHLD));
  name = sexp_intern(ctx, "signal/user2", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGUSR2));
  name = sexp_intern(ctx, "signal/user1", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGUSR1));
  name = sexp_intern(ctx, "signal/term", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTERM));
  name = sexp_intern(ctx, "signal/alarm", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGALRM));
  name = sexp_intern(ctx, "signal/pipe", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGPIPE));
  name = sexp_intern(ctx, "signal/segv", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGSEGV));
  name = sexp_intern(ctx, "signal/kill", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGKILL));
  name = sexp_intern(ctx, "signal/fpe", 10);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGFPE));
  name = sexp_intern(ctx, "signal/abort", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGABRT));
  name = sexp_intern(ctx, "signal/illegal", 14);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGILL));
  name = sexp_intern(ctx, "signal/quit", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGQUIT));
  name = sexp_intern(ctx, "signal/interrupt", 16);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGINT));
  name = sexp_intern(ctx, "signal/hang-up", 14);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGHUP));
  name = sexp_c_string(ctx, "sigset_t", -1);
  sexp_sigset_t_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_sigset_t_type_obj);
  tmp = sexp_make_type_predicate(ctx, name, sexp_sigset_t_type_obj);
  name = sexp_intern(ctx, "signal-set?", 11);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "siginfo_t", -1);
  sexp_siginfo_t_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_siginfo_t_type_obj);
  sexp_type_slots(sexp_siginfo_t_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_status", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_uid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_pid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_code", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_errno", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_signo", -1));
  sexp_type_getters(sexp_siginfo_t_type_obj) = sexp_make_vector(ctx, SEXP_SIX, SEXP_FALSE);
  sexp_type_setters(sexp_siginfo_t_type_obj) = sexp_make_vector(ctx, SEXP_SIX, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_siginfo_t_type_obj);
  name = sexp_intern(ctx, "signal-info?", 12);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "signal-status", 1, sexp_siginfo_t_get_si_status);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-uid", 1, sexp_siginfo_t_get_si_uid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-pid", 1, sexp_siginfo_t_get_si_pid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-code", 1, sexp_siginfo_t_get_si_code);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-error-number", 1, sexp_siginfo_t_get_si_errno);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-number", 1, sexp_siginfo_t_get_si_signo);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "parent-process-id", 0, sexp_parent_process_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-process-id", 0, sexp_current_process_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "execvp", 2, sexp_execvp_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
  }
  op = sexp_define_foreign(ctx, env, "%exit", 1, sexp_25_exit_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "kill", 2, sexp_kill_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "waitpid", 2, sexp_waitpid_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "fork", 0, sexp_fork_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "%fork", 0, sexp_25_fork_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "sleep", 1, sexp_sleep_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "alarm", 1, sexp_alarm_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-signal-mask", 0, sexp_current_signal_mask_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-mask-set!", 1, sexp_signal_mask_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-mask-unblock!", 1, sexp_signal_mask_unblock_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-mask-block!", 1, sexp_signal_mask_block_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-set-contains?", 2, sexp_signal_set_contains_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "signal-set-delete!", 2, sexp_signal_set_delete_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "signal-set-add!", 2, sexp_signal_set_add_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "signal-set-fill!", 1, sexp_signal_set_fill_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "make-signal-set", 0, sexp_make_signal_set_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "set-signal-action!", 2, sexp_set_signal_action_x_stub);
  sexp_init_signals(ctx, env);
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}